

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O1

void __thiscall GrcMasterTable::SetupFeatures(GrcMasterTable *this,GrcSymbolTable *psymtbl)

{
  _Base_ptr this_00;
  GdlFeatureDefn *pfeat;
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = p_Var1[1]._M_parent;
    if (*(long *)(*(long *)(p_Var1 + 1) + 0x68) == 0) {
      pfeat = (GdlFeatureDefn *)0x0;
    }
    else {
      pfeat = (GdlFeatureDefn *)
              __dynamic_cast(*(long *)(*(long *)(p_Var1 + 1) + 0x68),&GdlDefn::typeinfo,
                             &GdlFeatureDefn::typeinfo,0);
    }
    GrcMasterValueList::SetupFeatures((GrcMasterValueList *)this_00,pfeat,psymtbl);
  }
  return;
}

Assistant:

void GrcMasterTable::SetupFeatures(GrcSymbolTable * psymtbl)
{
	for (ValueListMap::iterator itvlistmap = EntriesBegin();
		itvlistmap != EntriesEnd();
		++itvlistmap)
	{
		Symbol psymFeatName = itvlistmap->first;  // GetKey();
		GrcMasterValueList * pmvl = itvlistmap->second; //GetValue();

		Assert(psymFeatName->FitsSymbolType(ksymtFeature));

		GdlFeatureDefn * pfeat = dynamic_cast<GdlFeatureDefn*>(psymFeatName->Data());
		Assert(pfeat);

		pmvl->SetupFeatures(pfeat, psymtbl);
	}
}